

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void WriteCompactSize<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>>
               (ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat> *os,uint64_t nSize
               )

{
  long *plVar1;
  pointer pbVar2;
  DataStream *pDVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [2];
  undefined1 auStack_26 [6];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (nSize < 0xfd) {
    plVar1 = (long *)(local_28 + 1);
    _local_28 = CONCAT71(stack0xffffffffffffffd9,(char)nSize);
    pDVar3 = os->m_substream;
    pbVar2 = (pDVar3->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else if (nSize < 0x10000) {
    _local_28 = CONCAT71(stack0xffffffffffffffd9,0xfd);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_substream,
               (os->m_substream->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,local_28);
    _local_28 = CONCAT62(auStack_26,(short)nSize);
    pDVar3 = os->m_substream;
    pbVar2 = (pDVar3->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    plVar1 = (long *)(local_28 + 2);
  }
  else if (nSize >> 0x20 == 0) {
    _local_28 = CONCAT71(stack0xffffffffffffffd9,0xfe);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_substream,
               (os->m_substream->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,local_28);
    _local_28 = CONCAT44(auStack_26._2_4_,(int)nSize);
    pDVar3 = os->m_substream;
    pbVar2 = (pDVar3->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    plVar1 = (long *)(local_28 + 4);
  }
  else {
    _local_28 = CONCAT71(stack0xffffffffffffffd9,0xff);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_substream,
               (os->m_substream->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,local_28);
    pDVar3 = os->m_substream;
    pbVar2 = (pDVar3->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    plVar1 = &local_20;
    _local_28 = nSize;
  }
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)pDVar3,pbVar2,local_28,plVar1
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}